

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O1

ostream * merlin::operator<<(ostream *os,variable_set *v)

{
  ulong uVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  if ((v->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (v->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    if (8 < (ulong)((long)(v->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(v->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
      uVar1 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)os);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)((long)(v->m_v).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(v->m_v).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream &os, variable_set const& v) {
		os << "[";
		if (v.nvar() != 0) {
			os << v.m_v[0];
			for (size_t i = 1; i < v.nvar(); i++)
				os << "," << v.m_v[i];
		}
		os << "]";
		return os;
	}